

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

bool llvm::AArch64::getExtensionFeatures
               (uint Extensions,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *pvVar1;
  value_type local_198;
  value_type local_188;
  value_type local_178;
  value_type local_168;
  value_type local_158;
  value_type local_148;
  value_type local_138;
  value_type local_128;
  value_type local_118;
  value_type local_108;
  value_type local_f8;
  value_type local_e8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *local_d8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features_local;
  uint Extensions_local;
  value_type *local_c0;
  char *local_b8;
  value_type *local_b0;
  char *local_a8;
  value_type *local_a0;
  char *local_98;
  value_type *local_90;
  char *local_88;
  value_type *local_80;
  char *local_78;
  value_type *local_70;
  char *local_68;
  value_type *local_60;
  char *local_58;
  value_type *local_50;
  char *local_48;
  value_type *local_40;
  char *local_38;
  value_type *local_30;
  char *local_28;
  value_type *local_20;
  char *local_18;
  value_type *local_10;
  
  if (Extensions == 0) {
    Features_local._7_1_ = false;
  }
  else {
    local_d8 = Features;
    Features_local._0_4_ = Extensions;
    if ((Extensions & 8) != 0) {
      local_c0 = &local_e8;
      _Extensions_local = "+fp-armv8";
      local_e8.Data = "+fp-armv8";
      local_e8.Length = strlen("+fp-armv8");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_e8);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x10) != 0) {
      local_b0 = &local_f8;
      local_b8 = "+neon";
      local_f8.Data = "+neon";
      local_f8.Length = strlen("+neon");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_f8);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 2) != 0) {
      local_a0 = &local_108;
      local_a8 = "+crc";
      local_108.Data = "+crc";
      local_108.Length = strlen("+crc");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_108);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 4) != 0) {
      local_90 = &local_118;
      local_98 = "+crypto";
      local_118.Data = "+crypto";
      local_118.Length = strlen("+crypto");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_118);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x400) != 0) {
      local_80 = &local_128;
      local_88 = "+dotprod";
      local_128.Data = "+dotprod";
      local_128.Length = strlen("+dotprod");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_128);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x20) != 0) {
      local_70 = &local_138;
      local_78 = "+fullfp16";
      local_138.Data = "+fullfp16";
      local_138.Length = strlen("+fullfp16");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_138);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x40) != 0) {
      local_60 = &local_148;
      local_68 = "+spe";
      local_148.Data = "+spe";
      local_148.Length = strlen("+spe");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_148);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x80) != 0) {
      local_50 = &local_158;
      local_58 = "+ras";
      local_158.Data = "+ras";
      local_158.Length = strlen("+ras");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_158);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x100) != 0) {
      local_40 = &local_168;
      local_48 = "+lse";
      local_168.Data = "+lse";
      local_168.Length = strlen("+lse");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_168);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x1000) != 0) {
      local_30 = &local_178;
      local_38 = "+rdm";
      local_178.Data = "+rdm";
      local_178.Length = strlen("+rdm");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_178);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x200) != 0) {
      local_20 = &local_188;
      local_28 = "+sve";
      local_188.Data = "+sve";
      local_188.Length = strlen("+sve");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_188);
    }
    pvVar1 = local_d8;
    if (((uint)Features_local & 0x800) != 0) {
      local_10 = &local_198;
      local_18 = "+rcpc";
      local_198.Data = "+rcpc";
      local_198.Length = strlen("+rcpc");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_198);
    }
    Features_local._7_1_ = true;
  }
  return Features_local._7_1_;
}

Assistant:

bool llvm::AArch64::getExtensionFeatures(unsigned Extensions,
                                     std::vector<StringRef> &Features) {

  if (Extensions == AArch64::AEK_INVALID)
    return false;

  if (Extensions & AArch64::AEK_FP)
    Features.push_back("+fp-armv8");
  if (Extensions & AArch64::AEK_SIMD)
    Features.push_back("+neon");
  if (Extensions & AArch64::AEK_CRC)
    Features.push_back("+crc");
  if (Extensions & AArch64::AEK_CRYPTO)
    Features.push_back("+crypto");
  if (Extensions & AArch64::AEK_DOTPROD)
    Features.push_back("+dotprod");
  if (Extensions & AArch64::AEK_FP16)
    Features.push_back("+fullfp16");
  if (Extensions & AArch64::AEK_PROFILE)
    Features.push_back("+spe");
  if (Extensions & AArch64::AEK_RAS)
    Features.push_back("+ras");
  if (Extensions & AArch64::AEK_LSE)
    Features.push_back("+lse");
  if (Extensions & AArch64::AEK_RDM)
    Features.push_back("+rdm");
  if (Extensions & AArch64::AEK_SVE)
    Features.push_back("+sve");
  if (Extensions & AArch64::AEK_RCPC)
    Features.push_back("+rcpc");

  return true;
}